

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  undefined1 local_a8 [8];
  string mode;
  string resultModelFile;
  string datasetFile;
  string alphabetFile;
  
  if (argc < 2) {
    PrintUsage(argv);
    return 0x2a;
  }
  std::__cxx11::string::string
            ((string *)local_a8,argv[1],(allocator *)(datasetFile.field_2._M_local_buf + 8));
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_a8,"train");
  if (bVar1) {
    if (4 < (uint)argc) {
      std::__cxx11::string::string
                ((string *)(datasetFile.field_2._M_local_buf + 8),argv[2],
                 (allocator *)(resultModelFile.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)(resultModelFile.field_2._M_local_buf + 8),argv[3],
                 (allocator *)(mode.field_2._M_local_buf + 8));
      std::__cxx11::string::string
                ((string *)(mode.field_2._M_local_buf + 8),argv[4],
                 (allocator *)(alphabetFile.field_2._M_local_buf + 0xf));
      Train((string *)((long)&datasetFile.field_2 + 8),
            (string *)((long)&resultModelFile.field_2 + 8),(string *)((long)&mode.field_2 + 8));
      std::__cxx11::string::~string((string *)(mode.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(resultModelFile.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(datasetFile.field_2._M_local_buf + 8));
      iVar2 = 0;
      goto LAB_001060af;
    }
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_a8,"score");
    if (bVar1) {
      if (argc != 2) {
        std::__cxx11::string::string
                  ((string *)(datasetFile.field_2._M_local_buf + 8),argv[2],
                   (allocator *)(resultModelFile.field_2._M_local_buf + 8));
        iVar2 = Score((string *)((long)&datasetFile.field_2 + 8));
        goto LAB_00106099;
      }
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_a8,"correct");
      if (bVar1) {
        if (argc != 2) {
          std::__cxx11::string::string
                    ((string *)(datasetFile.field_2._M_local_buf + 8),argv[2],
                     (allocator *)(resultModelFile.field_2._M_local_buf + 8));
          iVar2 = Correct((string *)((long)&datasetFile.field_2 + 8));
LAB_00106099:
          std::__cxx11::string::~string((string *)(datasetFile.field_2._M_local_buf + 8));
          goto LAB_001060af;
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_a8,"fix");
        if ((4 < (uint)argc) && (bVar1)) {
          std::__cxx11::string::string
                    ((string *)(datasetFile.field_2._M_local_buf + 8),argv[2],
                     (allocator *)(resultModelFile.field_2._M_local_buf + 8));
          std::__cxx11::string::string
                    ((string *)(resultModelFile.field_2._M_local_buf + 8),argv[3],
                     (allocator *)(mode.field_2._M_local_buf + 8));
          std::__cxx11::string::string
                    ((string *)(mode.field_2._M_local_buf + 8),argv[4],
                     (allocator *)(alphabetFile.field_2._M_local_buf + 0xf));
          iVar2 = Fix((string *)((long)&datasetFile.field_2 + 8),
                      (string *)((long)&resultModelFile.field_2 + 8),
                      (string *)((long)&mode.field_2 + 8));
          std::__cxx11::string::~string((string *)(mode.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(resultModelFile.field_2._M_local_buf + 8));
          goto LAB_00106099;
        }
      }
    }
  }
  PrintUsage(argv);
  iVar2 = 0x2a;
LAB_001060af:
  std::__cxx11::string::~string((string *)local_a8);
  return iVar2;
}

Assistant:

int main(int argc, const char** argv) {
    if (argc < 2) {
        PrintUsage(argv);
        return 42;
    }
    std::string mode = argv[1];
    if (mode == "train") {
        if (argc < 5) {
            PrintUsage(argv);
            return 42;
        }
        std::string alphabetFile = argv[2];
        std::string datasetFile = argv[3];
        std::string resultModelFile = argv[4];
        return Train(alphabetFile, datasetFile, resultModelFile);
    } else if (mode == "score") {
        if (argc < 3) {
            PrintUsage(argv);
            return 42;
        }
        std::string modelFile = argv[2];
        return Score(modelFile);
    } else if (mode == "correct") {
        if (argc < 3) {
            PrintUsage(argv);
            return 42;
        }
        std::string modelFile = argv[2];
        return Correct(modelFile);
    } else if (mode == "fix") {
        if (argc < 5) {
            PrintUsage(argv);
            return 42;
        }
        std::string modelFile = argv[2];
        std::string inFile = argv[3];
        std::string outFile = argv[4];
        return Fix(modelFile, inFile, outFile);
    }

    PrintUsage(argv);
    return 42;
}